

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::clear_ImputedValue(Imputer *this)

{
  DoubleVector *this_00;
  Int64Vector *this_01;
  StringToDoubleMap *this_02;
  Int64ToDoubleMap *this_03;
  ImputedValueCase IVar1;
  Arena *pAVar2;
  Imputer *this_local;
  
  IVar1 = ImputedValue_case(this);
  switch(IVar1) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    break;
  case kImputedInt64Value:
    break;
  case kImputedStringValue:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&this->ImputedValue_,pAVar2);
    break;
  case kImputedDoubleArray:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_00 = (this->ImputedValue_).imputeddoublearray_, this_00 != (DoubleVector *)0x0)) {
      DoubleVector::~DoubleVector(this_00);
      operator_delete(this_00,0x28);
    }
    break;
  case kImputedInt64Array:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_01 = (this->ImputedValue_).imputedint64array_, this_01 != (Int64Vector *)0x0)) {
      Int64Vector::~Int64Vector(this_01);
      operator_delete(this_01,0x28);
    }
    break;
  case kImputedStringDictionary:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_02 = (this->ImputedValue_).imputedstringdictionary_,
       this_02 != (StringToDoubleMap *)0x0)) {
      StringToDoubleMap::~StringToDoubleMap(this_02);
      operator_delete(this_02,0x48);
    }
    break;
  case kImputedInt64Dictionary:
    pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    if ((pAVar2 == (Arena *)0x0) &&
       (this_03 = (this->ImputedValue_).imputedint64dictionary_, this_03 != (Int64ToDoubleMap *)0x0)
       ) {
      Int64ToDoubleMap::~Int64ToDoubleMap(this_03);
      operator_delete(this_03,0x48);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void Imputer::clear_ImputedValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ImputedValue_case()) {
    case kImputedDoubleValue: {
      // No need to clear
      break;
    }
    case kImputedInt64Value: {
      // No need to clear
      break;
    }
    case kImputedStringValue: {
      ImputedValue_.imputedstringvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case kImputedDoubleArray: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputeddoublearray_;
      }
      break;
    }
    case kImputedInt64Array: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64array_;
      }
      break;
    }
    case kImputedStringDictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedstringdictionary_;
      }
      break;
    }
    case kImputedInt64Dictionary: {
      if (GetArenaForAllocation() == nullptr) {
        delete ImputedValue_.imputedint64dictionary_;
      }
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = IMPUTEDVALUE_NOT_SET;
}